

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::StreamArchive::decode_payload_deflate
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  pointer __p;
  size_t sVar4;
  mz_ulong mVar5;
  ulong __size;
  bool bVar6;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> zlib_buffer_holder;
  mz_ulong zsize;
  bool local_38;
  
  if ((entry->header).uncompressed_size != blob_size) {
    return false;
  }
  zlib_buffer_holder._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  zsize = (mz_ulong)&this->read_lock;
  local_38 = concurrent;
  if (concurrent) {
    std::mutex::lock((mutex *)zsize);
    __p = (pointer)operator_new__((ulong)(entry->header).payload_size);
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
               &zlib_buffer_holder,__p);
LAB_00144c9a:
    bVar6 = false;
    iVar2 = fseek((FILE *)this->file,entry->offset,0);
    if (-1 < iVar2) {
      sVar4 = fread(__p,1,(ulong)(entry->header).payload_size,(FILE *)this->file);
      bVar6 = sVar4 == (entry->header).payload_size;
    }
  }
  else {
    __p = this->zlib_buffer;
    __size = (ulong)(entry->header).payload_size;
    if (__size <= this->zlib_buffer_size) goto LAB_00144c9a;
    __p = (pointer)realloc(__p,__size);
    if (__p != (pointer)0x0) {
      this->zlib_buffer = __p;
      this->zlib_buffer_size = (ulong)(entry->header).payload_size;
      goto LAB_00144c9a;
    }
    free(this->zlib_buffer);
    this->zlib_buffer = (uint8_t *)0x0;
    this->zlib_buffer_size = 0;
    __p = (mz_uint8 *)0x0;
    bVar6 = false;
  }
  ConditionalLockGuard::~ConditionalLockGuard((ConditionalLockGuard *)&zsize);
  if (bVar6) {
    if (((entry->header).crc == 0) ||
       (mVar5 = mz_crc32(0,__p,(ulong)(entry->header).payload_size),
       (entry->header).crc == (uint32_t)mVar5)) {
      zsize = blob_size;
      iVar2 = mz_uncompress((uchar *)blob,&zsize,__p,(ulong)(entry->header).payload_size);
      bVar6 = zsize == blob_size && iVar2 == 0;
      goto LAB_00144d64;
    }
    LVar3 = get_thread_log_level();
    if ((int)LVar3 < 3) {
      bVar6 = false;
      bVar1 = Internal::log_thread_callback(LOG_ERROR,"CRC mismatch!\n");
      if (bVar1) goto LAB_00144d64;
      fwrite("Fossilize ERROR: CRC mismatch!\n",0x1f,1,_stderr);
    }
  }
  bVar6 = false;
LAB_00144d64:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&zlib_buffer_holder);
  return bVar6;
}

Assistant:

bool decode_payload_deflate(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.uncompressed_size != blob_size)
			return false;

		uint8_t *dst_zlib_buffer = nullptr;
		std::unique_ptr<uint8_t[]> zlib_buffer_holder;

		{
			ConditionalLockGuard holder(read_lock, concurrent);
			if (concurrent)
			{
				dst_zlib_buffer = new uint8_t[entry.header.payload_size];
				zlib_buffer_holder.reset(dst_zlib_buffer);
			}
			else if (zlib_buffer_size < entry.header.payload_size)
			{
				auto *new_zlib_buffer = static_cast<uint8_t *>(realloc(zlib_buffer, entry.header.payload_size));
				if (new_zlib_buffer)
				{
					zlib_buffer = new_zlib_buffer;
					zlib_buffer_size = entry.header.payload_size;
				}
				else
				{
					free(zlib_buffer);
					zlib_buffer = nullptr;
					zlib_buffer_size = 0;
				}

				if (!zlib_buffer)
					return false;

				dst_zlib_buffer = zlib_buffer;
			}
			else
				dst_zlib_buffer = zlib_buffer;

			if (fseek(file, entry.offset, SEEK_SET) < 0)
				return false;
			if (fread(dst_zlib_buffer, 1, entry.header.payload_size, file) != entry.header.payload_size)
				return false;
		}

		if (entry.header.crc != 0) // Verify checksum.
		{
			auto disk_crc = uint32_t(mz_crc32(MZ_CRC32_INIT, dst_zlib_buffer, entry.header.payload_size));
			if (disk_crc != entry.header.crc)
			{
				LOGE_LEVEL("CRC mismatch!\n");
				return false;
			}
		}

		mz_ulong zsize = blob_size;
		if (mz_uncompress(static_cast<unsigned char *>(blob), &zsize, dst_zlib_buffer, entry.header.payload_size) != MZ_OK)
			return false;
		if (zsize != blob_size)
			return false;

		return true;
	}